

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_decoder_init__internal
                    (ma_decoder_read_proc onRead,ma_decoder_seek_proc onSeek,void *pUserData,
                    ma_decoder_config *pConfig,ma_decoder *pDecoder)

{
  uint uVar1;
  ma_result mVar2;
  size_t *psVar3;
  
  uVar1 = *(uint *)(onSeek + 0x70);
  psVar3 = (size_t *)(ulong)uVar1;
  if (uVar1 != 0) {
    mVar2 = MA_NO_BACKEND;
    if (uVar1 == 1) {
      mVar2 = ma_decoder_init_from_vtable__internal
                        (&g_ma_decoding_backend_vtable_wav,(void *)0x0,(ma_decoder_config *)onSeek,
                         (ma_decoder *)pUserData);
      psVar3 = (size_t *)(ulong)*(uint *)(onSeek + 0x70);
    }
    if ((int)psVar3 == 2) {
      mVar2 = ma_decoder_init_from_vtable__internal
                        (&g_ma_decoding_backend_vtable_flac,(void *)0x0,(ma_decoder_config *)onSeek,
                         (ma_decoder *)pUserData);
      psVar3 = (size_t *)(ulong)*(uint *)(onSeek + 0x70);
    }
    if ((int)psVar3 == 3) {
      mVar2 = ma_decoder_init_from_vtable__internal
                        (&g_ma_decoding_backend_vtable_mp3,(void *)0x0,(ma_decoder_config *)onSeek,
                         (ma_decoder *)pUserData);
      psVar3 = (size_t *)(ulong)*(uint *)(onSeek + 0x70);
    }
    if ((int)psVar3 == 4) {
      psVar3 = (size_t *)pUserData;
      mVar2 = ma_decoder_init_from_vtable__internal
                        (&g_ma_decoding_backend_vtable_stbvorbis,(void *)0x0,
                         (ma_decoder_config *)onSeek,(ma_decoder *)pUserData);
    }
    if (mVar2 == MA_SUCCESS) goto LAB_0016ec2d;
    (*onRead)((ma_decoder *)pUserData,(void *)0x0,0,psVar3);
  }
  mVar2 = ma_decoder_init_custom__internal((ma_decoder_config *)onSeek,(ma_decoder *)pUserData);
  if (mVar2 == MA_SUCCESS) {
    if (*(int *)(onSeek + 0x70) == 0) goto LAB_0016ec2d;
  }
  else {
    (*onRead)((ma_decoder *)pUserData,(void *)0x0,0,psVar3);
    if (*(int *)(onSeek + 0x70) == 0) {
      psVar3 = (size_t *)pUserData;
      mVar2 = ma_decoder_init_from_vtable__internal
                        (&g_ma_decoding_backend_vtable_wav,(void *)0x0,(ma_decoder_config *)onSeek,
                         (ma_decoder *)pUserData);
      if (mVar2 != MA_SUCCESS) {
        (*onRead)((ma_decoder *)pUserData,(void *)0x0,0,psVar3);
        psVar3 = (size_t *)pUserData;
        mVar2 = ma_decoder_init_from_vtable__internal
                          (&g_ma_decoding_backend_vtable_flac,(void *)0x0,
                           (ma_decoder_config *)onSeek,(ma_decoder *)pUserData);
        if (mVar2 != MA_SUCCESS) {
          (*onRead)((ma_decoder *)pUserData,(void *)0x0,0,psVar3);
          psVar3 = (size_t *)pUserData;
          mVar2 = ma_decoder_init_from_vtable__internal
                            (&g_ma_decoding_backend_vtable_mp3,(void *)0x0,
                             (ma_decoder_config *)onSeek,(ma_decoder *)pUserData);
          if (mVar2 != MA_SUCCESS) {
            (*onRead)((ma_decoder *)pUserData,(void *)0x0,0,psVar3);
            psVar3 = (size_t *)pUserData;
            mVar2 = ma_decoder_init_from_vtable__internal
                              (&g_ma_decoding_backend_vtable_stbvorbis,(void *)0x0,
                               (ma_decoder_config *)onSeek,(ma_decoder *)pUserData);
            if (mVar2 != MA_SUCCESS) {
              (*onRead)((ma_decoder *)pUserData,(void *)0x0,0,psVar3);
              return mVar2;
            }
          }
        }
      }
LAB_0016ec2d:
      mVar2 = ma_decoder__postinit((ma_decoder_config *)onSeek,(ma_decoder *)pUserData);
      return mVar2;
    }
  }
  return MA_NO_BACKEND;
}

Assistant:

static ma_result ma_decoder_init__internal(ma_decoder_read_proc onRead, ma_decoder_seek_proc onSeek, void* pUserData, const ma_decoder_config* pConfig, ma_decoder* pDecoder)
{
    ma_result result = MA_NO_BACKEND;

    MA_ASSERT(pConfig != NULL);
    MA_ASSERT(pDecoder != NULL);

    /* Silence some warnings in the case that we don't have any decoder backends enabled. */
    (void)onRead;
    (void)onSeek;
    (void)pUserData;


    /* If we've specified a specific encoding type, try that first. */
    if (pConfig->encodingFormat != ma_encoding_format_unknown) {
    #ifdef MA_HAS_WAV
        if (pConfig->encodingFormat == ma_encoding_format_wav) {
            result = ma_decoder_init_wav__internal(pConfig, pDecoder);
        }
    #endif
    #ifdef MA_HAS_FLAC
        if (pConfig->encodingFormat == ma_encoding_format_flac) {
            result = ma_decoder_init_flac__internal(pConfig, pDecoder);
        }
    #endif
    #ifdef MA_HAS_MP3
        if (pConfig->encodingFormat == ma_encoding_format_mp3) {
            result = ma_decoder_init_mp3__internal(pConfig, pDecoder);
        }
    #endif
    #ifdef MA_HAS_VORBIS
        if (pConfig->encodingFormat == ma_encoding_format_vorbis) {
            result = ma_decoder_init_vorbis__internal(pConfig, pDecoder);
        }
    #endif

        /* If we weren't able to initialize the decoder, seek back to the start to give the next attempts a clean start. */
        if (result != MA_SUCCESS) {
            onSeek(pDecoder, 0, ma_seek_origin_start);
        }
    }

    if (result != MA_SUCCESS) {
        /* Getting here means we couldn't load a specific decoding backend based on the encoding format. */

        /*
        We use trial and error to open a decoder. We prioritize custom decoders so that if they
        implement the same encoding format they take priority over the built-in decoders.
        */
        if (result != MA_SUCCESS) {
            result = ma_decoder_init_custom__internal(pConfig, pDecoder);
            if (result != MA_SUCCESS) {
                onSeek(pDecoder, 0, ma_seek_origin_start);
            }
        }

        /*
        If we get to this point and we still haven't found a decoder, and the caller has requested a
        specific encoding format, there's no hope for it. Abort.
        */
        if (pConfig->encodingFormat != ma_encoding_format_unknown) {
            return MA_NO_BACKEND;
        }

    #ifdef MA_HAS_WAV
        if (result != MA_SUCCESS) {
            result = ma_decoder_init_wav__internal(pConfig, pDecoder);
            if (result != MA_SUCCESS) {
                onSeek(pDecoder, 0, ma_seek_origin_start);
            }
        }
    #endif
    #ifdef MA_HAS_FLAC
        if (result != MA_SUCCESS) {
            result = ma_decoder_init_flac__internal(pConfig, pDecoder);
            if (result != MA_SUCCESS) {
                onSeek(pDecoder, 0, ma_seek_origin_start);
            }
        }
    #endif
    #ifdef MA_HAS_MP3
        if (result != MA_SUCCESS) {
            result = ma_decoder_init_mp3__internal(pConfig, pDecoder);
            if (result != MA_SUCCESS) {
                onSeek(pDecoder, 0, ma_seek_origin_start);
            }
        }
    #endif
    #ifdef MA_HAS_VORBIS
        if (result != MA_SUCCESS) {
            result = ma_decoder_init_vorbis__internal(pConfig, pDecoder);
            if (result != MA_SUCCESS) {
                onSeek(pDecoder, 0, ma_seek_origin_start);
            }
        }
    #endif
    }

    if (result != MA_SUCCESS) {
        return result;
    }

    return ma_decoder__postinit(pConfig, pDecoder);
}